

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::distance_comparison_task
          (tree_clusterizer<crnlib::vec<2U,_float>_> *this,uint64 data,void *pData_ptr)

{
  int iVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  distance_comparison_task_params *pParams;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  long lVar9;
  float dist2;
  float fVar10;
  float dist2_1;
  float fVar11;
  float fVar12;
  
  iVar1 = *(int *)((long)pData_ptr + 0x10);
  uVar7 = (ulong)(uint)(*(int *)((long)pData_ptr + 0x14) - iVar1);
  uVar6 = (int)((uVar7 * data) / (ulong)*(uint *)((long)pData_ptr + 0x18)) + iVar1;
  uVar5 = (int)(((data + 1) * uVar7) / (ulong)*(uint *)((long)pData_ptr + 0x18)) + iVar1;
  if (uVar6 < uVar5) {
    lVar2 = *pData_ptr;
    lVar3 = *(long *)((long)pData_ptr + 8);
    uVar7 = (ulong)uVar6;
    do {
      uVar6 = (this->m_vectorsInfo).m_p[uVar7].index;
      fVar10 = 0.0;
      lVar9 = 0;
      bVar4 = true;
      do {
        bVar8 = bVar4;
        fVar11 = *(float *)(lVar2 + lVar9 * 4) - this->m_vectors[uVar6].m_s[lVar9];
        fVar10 = fVar10 + fVar11 * fVar11;
        lVar9 = 1;
        bVar4 = false;
      } while (bVar8);
      fVar11 = 0.0;
      lVar9 = 0;
      bVar4 = true;
      do {
        bVar8 = bVar4;
        fVar12 = *(float *)(lVar3 + lVar9 * 4) - this->m_vectors[uVar6].m_s[lVar9];
        fVar11 = fVar11 + fVar12 * fVar12;
        lVar9 = 1;
        bVar4 = false;
      } while (bVar8);
      (this->m_vectorComparison).m_p[uVar7] = fVar10 < fVar11;
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar5);
  }
  return;
}

Assistant:

void distance_comparison_task(uint64 data, void* pData_ptr) {
    distance_comparison_task_params* pParams = (distance_comparison_task_params*)pData_ptr;
    const VectorType& left_child = *pParams->left_child;
    const VectorType& right_child = *pParams->right_child;
    uint begin = pParams->begin + (pParams->end - pParams->begin) * data / pParams->num_tasks;
    uint end = pParams->begin + (pParams->end - pParams->begin) * (data + 1) / pParams->num_tasks;
    for (uint i = begin; i < end; i++) {
      const VectorType& v = m_vectors[m_vectorsInfo[i].index];
      double left_dist2 = left_child.squared_distance(v);
      double right_dist2 = right_child.squared_distance(v);
      m_vectorComparison[i] = left_dist2 < right_dist2;
    }
  }